

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonius.hpp
# Opt level: O0

outlier_classification *
nonius::detail::
classify_outliers<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
          (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> first,
          __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> last)

{
  bool bVar1;
  iterator first_00;
  iterator last_00;
  reference pdVar2;
  outlier_classification *in_RDI;
  vector<double,_std::allocator<double>_> *pvVar3;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> *__lhs;
  double dVar4;
  double dVar5;
  double dVar6;
  double *t;
  double his;
  double him;
  double lom;
  double los;
  double iqr;
  double q3;
  double q1;
  vector<double,_std::allocator<double>_> copy;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff18;
  vector<double,_std::allocator<double>_> *this;
  vector<double,_std::allocator<double>_> *this_00;
  allocator_type *__a;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff50;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_ffffffffffffff58;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_ffffffffffffff60;
  undefined8 in_stack_ffffffffffffff78;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_ffffffffffffff80;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_ffffffffffffff88;
  allocator_type local_39 [17];
  vector<double,_std::allocator<double>_> local_28;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_8;
  
  __a = local_39;
  std::allocator<double>::allocator((allocator<double> *)0x21e2b3);
  std::vector<double,std::allocator<double>>::
  vector<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,void>
            (in_stack_ffffffffffffff50,in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,__a);
  std::allocator<double>::~allocator((allocator<double> *)0x21e2e4);
  std::vector<double,_std::allocator<double>_>::begin(in_stack_ffffffffffffff18);
  std::vector<double,_std::allocator<double>_>::end(in_stack_ffffffffffffff18);
  pvVar3 = (vector<double,_std::allocator<double>_> *)
           weighted_average_quantile<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
                     ((int)((ulong)in_stack_ffffffffffffff78 >> 0x20),(int)in_stack_ffffffffffffff78
                      ,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
  this = &local_28;
  this_00 = pvVar3;
  first_00 = std::vector<double,_std::allocator<double>_>::begin(this);
  last_00 = std::vector<double,_std::allocator<double>_>::end(this);
  __lhs = (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> *)
          weighted_average_quantile<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
                    ((int)((ulong)in_stack_ffffffffffffff78 >> 0x20),(int)in_stack_ffffffffffffff78,
                     (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
                     first_00._M_current,
                     (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
                     last_00._M_current);
  dVar4 = (double)__lhs - (double)pvVar3;
  dVar5 = (double)__lhs + dVar4 * 1.5;
  dVar6 = (double)__lhs + dVar4 * 3.0;
  outlier_classification::outlier_classification(in_RDI);
  while (bVar1 = __gnu_cxx::operator!=
                           (__lhs,(__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                                   *)this), bVar1) {
    pdVar2 = __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
             operator*(&local_8);
    if ((double)pvVar3 - dVar4 * 3.0 <= *pdVar2) {
      if ((double)pvVar3 - dVar4 * 1.5 <= *pdVar2) {
        if (*pdVar2 <= dVar6) {
          if (dVar5 < *pdVar2) {
            in_RDI->high_mild = in_RDI->high_mild + 1;
          }
        }
        else {
          in_RDI->high_severe = in_RDI->high_severe + 1;
        }
      }
      else {
        in_RDI->low_mild = in_RDI->low_mild + 1;
      }
    }
    else {
      in_RDI->low_severe = in_RDI->low_severe + 1;
    }
    in_RDI->samples_seen = in_RDI->samples_seen + 1;
    __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
    operator++(&local_8);
  }
  std::vector<double,_std::allocator<double>_>::~vector(this_00);
  return in_RDI;
}

Assistant:

outlier_classification classify_outliers(Iterator first, Iterator last) {
            std::vector<double> copy(first, last);

            auto q1 = weighted_average_quantile(1, 4, copy.begin(), copy.end());
            auto q3 = weighted_average_quantile(3, 4, copy.begin(), copy.end());
            auto iqr = q3 - q1;
            auto los = q1 - (iqr * 3.);
            auto lom = q1 - (iqr * 1.5);
            auto him = q3 + (iqr * 1.5);
            auto his = q3 + (iqr * 3.);

            outlier_classification o;
            for(; first != last; ++first) {
                auto&& t = *first;
                if(t < los) ++o.low_severe;
                else if(t < lom) ++o.low_mild;
                else if(t > his) ++o.high_severe;
                else if(t > him) ++o.high_mild;
                ++o.samples_seen;
            }
            return o;
        }